

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O3

bool TestHighbitsCollisions<unsigned_long>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes)

{
  pointer puVar1;
  byte bVar2;
  undefined8 uVar3;
  uint __exponent;
  uint uVar4;
  ulong in_RCX;
  ulong uVar5;
  ulong uVar6;
  int in_ESI;
  ulong uVar7;
  int nbHashes;
  uint uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  double in_XMM0_Qa;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  double local_50;
  double local_48;
  undefined1 auVar18 [64];
  undefined1 auVar12 [32];
  undefined1 auVar11 [32];
  
  nbHashes = (int)((ulong)((long)(hashes->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(hashes->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
  __exponent = FindMinBits_TargetCollisionShare(nbHashes,in_XMM0_Qa);
  uVar4 = FindMaxBits_TargetCollisionNb(nbHashes,in_ESI);
  if ((int)uVar4 < 0x40) {
    uVar7 = 0;
    printf("Testing collisions (high %2i-%2i bits) - ",(ulong)__exponent,(ulong)uVar4);
    if ((int)uVar4 < (int)__exponent) {
      printf("Worst is %2i bits: %2i/%2i (%.2fx)",0,0,0,1);
    }
    else {
      auVar21._0_8_ = (double)nbHashes;
      auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar8 = 0;
      local_48 = 1.0;
      local_50 = 0.0;
      do {
        puVar1 = (hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar6 = 0;
        uVar5 = (long)(hashes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
        if (1 < uVar5) {
          auVar14 = vpbroadcastq_avx512f();
          in_RCX = uVar5 + 6 & 0xfffffffffffffff8;
          uVar5 = 0;
          auVar15 = vpbroadcastq_avx512f();
          auVar16 = ZEXT1664((undefined1  [16])0x0);
          do {
            auVar22 = auVar16;
            auVar16 = vpbroadcastq_avx512f();
            auVar16 = vporq_avx512f(auVar16,auVar13);
            uVar6 = vpcmpuq_avx512f(auVar16,auVar14,2);
            auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])(puVar1 + uVar5));
            bVar2 = (byte)uVar6;
            auVar17._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar16._8_8_;
            auVar17._0_8_ = (ulong)(bVar2 & 1) * auVar16._0_8_;
            auVar17._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar16._16_8_;
            auVar17._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar16._24_8_;
            auVar17._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar16._32_8_;
            auVar17._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar16._40_8_;
            auVar17._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar16._48_8_;
            auVar17._56_8_ = (uVar6 >> 7) * auVar16._56_8_;
            auVar16 = vpsrlvq_avx512f(auVar17,auVar15);
            auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])(puVar1 + uVar5 + 1));
            auVar18._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar17._8_8_;
            auVar18._0_8_ = (ulong)(bVar2 & 1) * auVar17._0_8_;
            auVar18._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar17._16_8_;
            auVar18._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar17._24_8_;
            auVar18._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar17._32_8_;
            auVar18._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar17._40_8_;
            auVar18._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar17._48_8_;
            auVar18._56_8_ = (uVar6 >> 7) * auVar17._56_8_;
            uVar5 = uVar5 + 8;
            auVar17 = vpsrlvq_avx512f(auVar18,auVar15);
            uVar3 = vpcmpeqq_avx512f(auVar16,auVar17);
            auVar11 = vpmovm2d_avx512vl(uVar3);
            auVar11 = vpsubd_avx2(auVar22._0_32_,auVar11);
            auVar16 = ZEXT3264(auVar11);
          } while (in_RCX != uVar5);
          auVar11 = vmovdqa32_avx512vl(auVar11);
          auVar10._0_4_ =
               (uint)(bVar2 & 1) * auVar11._0_4_ | (uint)!(bool)(bVar2 & 1) * auVar22._0_4_;
          bVar9 = (bool)((byte)(uVar6 >> 1) & 1);
          auVar10._4_4_ = (uint)bVar9 * auVar11._4_4_ | (uint)!bVar9 * auVar22._4_4_;
          bVar9 = (bool)((byte)(uVar6 >> 2) & 1);
          auVar10._8_4_ = (uint)bVar9 * auVar11._8_4_ | (uint)!bVar9 * auVar22._8_4_;
          bVar9 = (bool)((byte)(uVar6 >> 3) & 1);
          auVar10._12_4_ = (uint)bVar9 * auVar11._12_4_ | (uint)!bVar9 * auVar22._12_4_;
          bVar9 = (bool)((byte)(uVar6 >> 4) & 1);
          auVar12._16_4_ = (uint)bVar9 * auVar11._16_4_ | (uint)!bVar9 * auVar22._16_4_;
          auVar12._0_16_ = auVar10;
          bVar9 = (bool)((byte)(uVar6 >> 5) & 1);
          auVar12._20_4_ = (uint)bVar9 * auVar11._20_4_ | (uint)!bVar9 * auVar22._20_4_;
          bVar9 = (bool)((byte)(uVar6 >> 6) & 1);
          auVar12._24_4_ = (uint)bVar9 * auVar11._24_4_ | (uint)!bVar9 * auVar22._24_4_;
          bVar9 = SUB81(uVar6 >> 7,0);
          auVar12._28_4_ = (uint)bVar9 * auVar11._28_4_ | (uint)!bVar9 * auVar22._28_4_;
          auVar10 = vphaddd_avx(auVar12._16_16_,auVar10);
          auVar10 = vphaddd_avx(auVar10,auVar10);
          auVar10 = vphaddd_avx(auVar10,auVar10);
          uVar6 = (ulong)auVar10._0_4_;
        }
        dVar19 = ldexp(1.0,__exponent);
        auVar20._0_8_ = (auVar21._0_8_ * (double)(nbHashes + -1)) / dVar19;
        auVar20._8_8_ = 0;
        auVar21._8_8_ = 0;
        auVar10 = vminsd_avx(auVar21,auVar20);
        dVar19 = (double)(int)uVar6 / auVar10._0_8_;
        if (local_50 < dVar19) {
          uVar7 = uVar6;
          uVar8 = __exponent;
          local_50 = dVar19;
          local_48 = auVar10._0_8_;
        }
        auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        bVar9 = __exponent != uVar4;
        __exponent = __exponent + 1;
      } while (bVar9);
      printf("Worst is %2i bits: %2i/%2i (%.2fx)",(ulong)uVar8,uVar7,
             CONCAT44((int)(in_RCX >> 0x20),(int)local_48));
      if (2.0 < local_50) {
        puts(" !!!!!");
        return false;
      }
    }
    putchar(10);
  }
  return true;
}

Assistant:

bool TestHighbitsCollisions ( std::vector<hashtype> & hashes)
{
  int origBits = sizeof(hashtype) * 8;

  size_t const nbH = hashes.size();
  int const minBits = FindMinBits_TargetCollisionShare(nbH, 0.01);
  int const maxBits = FindMaxBits_TargetCollisionNb(nbH, 20);
  if (maxBits >= origBits) return true;

  printf("Testing collisions (high %2i-%2i bits) - ", minBits, maxBits);
  double maxCollDev = 0.0;
  int maxCollDevBits = 0;
  int maxCollDevNb = 0;
  double maxCollDevExp = 1.0;

  for (int b = minBits; b <= maxBits; b++) {
      int    const nbColls = CountNbCollisions(hashes, b);
      double const expected = EstimateNbCollisions(nbH, b);
      assert(expected > 0.0);
      double const dev = (double)nbColls / expected;
      if (dev > maxCollDev) {
          maxCollDev = dev;
          maxCollDevBits = b;
          maxCollDevNb = nbColls;
          maxCollDevExp = expected;
      }
  }

  printf("Worst is %2i bits: %2i/%2i (%.2fx)",
        maxCollDevBits, maxCollDevNb, (int)maxCollDevExp, maxCollDev);

  if (maxCollDev > 2.0) {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}